

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O1

char * rapidjson::internal::Prettify(char *buffer,int length,int k)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  
  uVar1 = k + length;
  if ((int)uVar1 < 0x16 && -1 < k) {
    if (0 < k) {
      uVar3 = length + 1U;
      if ((int)(length + 1U) < (int)uVar1) {
        uVar3 = uVar1;
      }
      memset(buffer + length,0x30,(ulong)(~length + uVar3) + 1);
    }
    pcVar2 = buffer + (int)uVar1;
    pcVar2[0] = '.';
    pcVar2[1] = '0';
    return pcVar2 + 2;
  }
  uVar3 = uVar1 - 1;
  if (uVar3 < 0x15) {
    memmove(buffer + uVar1 + 1,buffer + uVar1,(long)-k);
    buffer[uVar1] = '.';
    return buffer + (long)length + 1;
  }
  if (uVar1 + 5 < 6) {
    uVar3 = 2 - uVar1;
    memmove(buffer + uVar3,buffer,(long)length);
    buffer[0] = '0';
    buffer[1] = '.';
    if ((int)uVar1 < 0) {
      uVar1 = 3;
      if (3 < (int)uVar3) {
        uVar1 = uVar3;
      }
      memset(buffer + 2,0x30,(ulong)(uVar1 - 2));
    }
    return buffer + (int)(uVar3 + length);
  }
  if (length == 1) {
    buffer[1] = 'e';
    if (-1 < (int)uVar3) {
      pcVar2 = buffer + 2;
      goto LAB_00112337;
    }
  }
  else {
    memmove(buffer + 2,buffer + 1,(long)(length + -1));
    buffer[1] = '.';
    buffer[(long)length + 1] = 'e';
    if (-1 < (int)uVar3) {
      pcVar2 = buffer + (long)length + 2;
      goto LAB_00112337;
    }
    buffer = buffer + length;
  }
  buffer[2] = '-';
  pcVar2 = buffer + 3;
  uVar3 = 1 - uVar1;
LAB_00112337:
  if ((int)uVar3 < 100) {
    if ((int)uVar3 < 10) {
      *pcVar2 = (char)uVar3 + '0';
      pcVar2 = pcVar2 + 1;
    }
    else {
      *(undefined2 *)pcVar2 = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)uVar3 * 2);
      pcVar2 = pcVar2 + 2;
    }
  }
  else {
    *pcVar2 = (char)(uVar3 / 100) + '0';
    *(undefined2 *)(pcVar2 + 1) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar3 % 100) * 2);
    pcVar2 = pcVar2 + 3;
  }
  return pcVar2;
}

Assistant:

inline char* Prettify(char* buffer, int length, int k) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (length <= kk && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], length - kk);
        buffer[kk] = '.';
        return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], length);
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        return &buffer[length + offset];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], length - 1);
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}